

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O3

void huntAndUnregister(QList<QStringView> *pathComponents,int i,UnregisterMode mode,
                      ObjectTreeNode *node)

{
  long lVar1;
  QStringView *pQVar2;
  char cVar3;
  iterator iVar4;
  iterator iVar5;
  DataList *this;
  long lVar6;
  QStringView QVar7;
  QStringView QVar8;
  
  lVar6 = (long)i;
  if ((pathComponents->d).size == lVar6) {
    (node->field_2).obj = (QObject *)0x0;
    (node->flags).super_QFlagsStorageHelper<QDBusConnection::RegisterOption,_4>.
    super_QFlagsStorage<QDBusConnection::RegisterOption>.i = 0;
    if (mode == UnregisterTree) {
      QList<QDBusConnectionPrivate::ObjectTreeNode>::clear(&node->children);
      return;
    }
  }
  else {
    this = &node->children;
    iVar4 = QList<QDBusConnectionPrivate::ObjectTreeNode>::end(this);
    iVar5 = QList<QDBusConnectionPrivate::ObjectTreeNode>::begin(this);
    iVar5 = std::
            __lower_bound<QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator,QStringView,__gnu_cxx::__ops::_Iter_less_val>
                      (iVar5.i,iVar4.i,(pathComponents->d).ptr + lVar6);
    if (iVar5.i != iVar4.i) {
      lVar1 = ((iVar5.i)->name).d.size;
      pQVar2 = (pathComponents->d).ptr;
      if (lVar1 == pQVar2[lVar6].m_size) {
        QVar7.m_data = ((iVar5.i)->name).d.ptr;
        QVar7.m_size = lVar1;
        QVar8.m_data = pQVar2[lVar6].m_data;
        QVar8.m_size = lVar1;
        cVar3 = QtPrivate::equalStrings(QVar7,QVar8);
        if (cVar3 != '\0') {
          huntAndUnregister(pathComponents,i + 1,mode,iVar5.i);
          if ((((iVar5.i)->field_2).obj == (QObject *)0x0) && (((iVar5.i)->children).d.size == 0)) {
            QList<QDBusConnectionPrivate::ObjectTreeNode>::erase
                      (this,(const_iterator)iVar5.i,iVar5.i + 1);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void huntAndUnregister(const QList<QStringView> &pathComponents, int i,
                              QDBusConnection::UnregisterMode mode,
                              QDBusConnectionPrivate::ObjectTreeNode *node)
{
    if (pathComponents.size() == i) {
        // found it
        node->obj = nullptr;
        node->flags = {};

        if (mode == QDBusConnection::UnregisterTree) {
            // clear the sub-tree as well
            node->children.clear();  // can't disconnect the objects because we really don't know if they can
                            // be found somewhere else in the path too
        }
    } else {
        // keep going
        QDBusConnectionPrivate::ObjectTreeNode::DataList::Iterator end = node->children.end();
        QDBusConnectionPrivate::ObjectTreeNode::DataList::Iterator it =
            std::lower_bound(node->children.begin(), end, pathComponents.at(i));
        if (it == end || it->name != pathComponents.at(i))
            return;              // node not found

        huntAndUnregister(pathComponents, i + 1, mode, &(*it));
        if (!it->isActive())
            node->children.erase(it);
    }
}